

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O0

_Bool XCore_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *MI,uint16_t *size,uint64_t address,
                void *info)

{
  _Bool _Var1;
  DecodeStatus DVar2;
  uint32_t local_48;
  DecodeStatus Result;
  uint32_t insn32;
  uint16_t insn16;
  uint64_t address_local;
  uint16_t *size_local;
  MCInst *MI_local;
  size_t code_len_local;
  uint8_t *code_local;
  csh ud_local;
  
  _insn32 = address;
  address_local = (uint64_t)size;
  size_local = (uint16_t *)MI;
  MI_local = (MCInst *)code_len;
  code_len_local = (size_t)code;
  code_local = (uint8_t *)ud;
  _Var1 = readInstruction16(code,code_len,(uint16_t *)((long)&Result + 2));
  if (_Var1) {
    if (*(long *)(*(long *)(size_local + 0x188) + 0xe8) != 0) {
      memset(*(void **)(*(long *)(size_local + 0x188) + 0xe8),0,0x5f8);
    }
    DVar2 = decodeInstruction_2(DecoderTable16,(MCInst *)size_local,Result._2_2_,_insn32,
                                (MCRegisterInfo *)info,0);
    if (DVar2 == MCDisassembler_Fail) {
      _Var1 = readInstruction32((uint8_t *)code_len_local,(size_t)MI_local,&local_48);
      if (_Var1) {
        DVar2 = decodeInstruction_4(DecoderTable32,(MCInst *)size_local,local_48,_insn32,
                                    (MCRegisterInfo *)info,0);
        if (DVar2 == MCDisassembler_Fail) {
          ud_local._7_1_ = false;
        }
        else {
          *(undefined2 *)address_local = 4;
          ud_local._7_1_ = DVar2 != MCDisassembler_Fail;
        }
      }
      else {
        ud_local._7_1_ = false;
      }
    }
    else {
      *(undefined2 *)address_local = 2;
      ud_local._7_1_ = DVar2 != MCDisassembler_Fail;
    }
  }
  else {
    ud_local._7_1_ = false;
  }
  return ud_local._7_1_;
}

Assistant:

bool XCore_getInstruction(csh ud, const uint8_t *code, size_t code_len, MCInst *MI,
		uint16_t *size, uint64_t address, void *info)
{
	uint16_t insn16;
	uint32_t insn32;
	DecodeStatus Result;

	if (!readInstruction16(code, code_len, &insn16)) {
		return MCDisassembler_Fail;
	}

	if (MI->flat_insn->detail) {
		memset(MI->flat_insn->detail, 0, sizeof(cs_detail));
	}

	// Calling the auto-generated decoder function.
	Result = decodeInstruction_2(DecoderTable16, MI, insn16, address, info, 0);
	if (Result != MCDisassembler_Fail) {
		*size = 2;
		return Result;
	}

	if (!readInstruction32(code, code_len, &insn32)) {
		return MCDisassembler_Fail;
	}

	// Calling the auto-generated decoder function.
	Result = decodeInstruction_4(DecoderTable32, MI, insn32, address, info, 0);
	if (Result != MCDisassembler_Fail) {
		*size = 4;
		return Result;
	}

	return MCDisassembler_Fail;
}